

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xcursor.c
# Opt level: O1

void Init_XCursor(void)

{
  long lVar1;
  DLword *bitmap;
  
  bitmap = IOPage->dlcursorbitmap;
  cursorlist = (MXCURSOR *)malloc(0x30);
  cursorlist->next = (MXCURSOR *)0x0;
  lVar1 = 0;
  do {
    cursorlist->bitmap[lVar1] = bitmap[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x10);
  set_Xcursor(currentdsp,(uint8_t *)bitmap,0,0,&cursorlist->Xid,1);
  XDefineCursor(currentdsp->display_id,currentdsp->DisplayWindow,cursorlist->Xid);
  return;
}

Assistant:

void Init_XCursor(void) {
  int i;
  DLword *newbm = (DLword *)(IOPage->dlcursorbitmap);

  TPRINT(("TRACE: Init_DisplayCursor()\n"));
  /* this is guaranteed to be our first cursor, isn't it? */
  cursorlist = (struct MXCURSOR *)malloc(sizeof(struct MXCURSOR));
  cursorlist->next = NULL;
  for (i = 0; i < CURSORHEIGHT; i++) cursorlist->bitmap[i] = newbm[i];
  set_Xcursor(currentdsp, (uint8_t *)newbm, 0, 0, &(cursorlist->Xid), 1);
  DefineCursor(currentdsp, currentdsp->DisplayWindow, &(cursorlist->Xid));
}